

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void spo_region(sp_coder *coder,level *lev)

{
  schar sVar1;
  int iVar2;
  bool bVar3;
  byte local_53;
  region_conflict local_51;
  byte local_4a;
  region_conflict tmpregion;
  boolean room_not_needed;
  boolean prefilled;
  mkroom *troom;
  xchar dy2;
  xchar dx2;
  xchar dy1;
  opvar *poStack_38;
  xchar dx1;
  opvar *area;
  opvar *rirreg;
  opvar *rlit;
  opvar *rtype;
  level *lev_local;
  sp_coder *coder_local;
  
  rtype = (opvar *)lev;
  lev_local = (level *)coder;
  area = splev_stack_getdat(coder,'\x01');
  if ((((area != (opvar *)0x0) &&
       (rlit = splev_stack_getdat((sp_coder *)lev_local,'\x01'), rlit != (opvar *)0x0)) &&
      (rirreg = splev_stack_getdat((sp_coder *)lev_local,'\x01'), rirreg != (opvar *)0x0)) &&
     (poStack_38 = splev_stack_getdat((sp_coder *)lev_local,'\x05'), poStack_38 != (opvar *)0x0)) {
    tmpregion.x1 = 0x20 < (rlit->vardata).l;
    if ((bool)tmpregion.x1) {
      (rlit->vardata).str = (char *)((rlit->vardata).l + -0x21);
    }
    if ((rirreg->vardata).l < 0) {
      sVar1 = depth((d_level *)&rtype[0x1017].vardata);
      iVar2 = (int)sVar1;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar2 = rnd(iVar2 + 1);
      bVar3 = false;
      if (iVar2 < 0xb) {
        iVar2 = rn2(0x4d);
        bVar3 = iVar2 != 0;
      }
      rirreg->vardata = (anon_union_8_2_f9ece2e6_for_vardata)(long)(int)(uint)bVar3;
    }
    troom._7_1_ = (char)(poStack_38->vardata).l;
    troom._6_1_ = (char)((ulong)(poStack_38->vardata).l >> 8);
    troom._5_1_ = (char)((ulong)(poStack_38->vardata).l >> 0x10);
    troom._4_1_ = (char)((ulong)(poStack_38->vardata).l >> 0x18);
    get_location((level *)rtype,(schar *)((long)&troom + 7),(schar *)((long)&troom + 6),3,
                 (mkroom *)0x0);
    get_location((level *)rtype,(schar *)((long)&troom + 5),(schar *)((long)&troom + 4),3,
                 (mkroom *)0x0);
    local_53 = 0;
    if (((rlit->vardata).str == (char *)0x0) && (local_53 = 0, (area->vardata).str == (char *)0x0))
    {
      local_53 = tmpregion.x1 != '\0' ^ 0xff;
    }
    local_4a = local_53 & 1;
    if ((local_4a == 0) && (*(int *)&rtype[0x1016].field_0x4 < 0x28)) {
      register0x00000000 =
           (mkroom *)((long)rtype + (long)*(int *)&rtype[0x1016].field_0x4 * 0xd8 + 0xb960);
      if ((rlit->vardata).str != (char *)0x0) {
        sVar1 = '\x01';
        if (tmpregion.x1 != '\0') {
          sVar1 = '\x02';
        }
        register0x00000000->needfill = sVar1;
      }
      if ((area->vardata).str == (char *)0x0) {
        add_room((level *)rtype,(int)troom._7_1_,(int)troom._6_1_,(int)troom._5_1_,(int)troom._4_1_,
                 (boolean)(rirreg->vardata).l,(schar)(rlit->vardata).l,'\x01');
        topologize((level *)rtype,stack0xffffffffffffffb8);
      }
      else {
        min_rx = (int)troom._7_1_;
        min_ry = (int)troom._6_1_;
        max_rx = min_rx;
        max_ry = min_ry;
        flood_fill_rm((level *)rtype,(int)troom._7_1_,(int)troom._6_1_,
                      *(int *)&rtype[0x1016].field_0x4 + 3,(boolean)(rirreg->vardata).l,'\x01');
        add_room((level *)rtype,min_rx,min_ry,max_rx,max_ry,'\0',(schar)(rlit->vardata).l,'\x01');
        stack0xffffffffffffffb8->rlit = (schar)(rirreg->vardata).l;
        stack0xffffffffffffffb8->irregular = '\x01';
      }
      if (local_4a == 0) {
        if (*(int *)(lev_local->locations[0] + 2) < 2) {
          *(mkroom **)(lev_local->levname + (long)*(int *)(lev_local->locations[0] + 2) * 8 + 0x20)
               = stack0xffffffffffffffb8;
          (&lev_local->locations[0][1].typ)[*(int *)(lev_local->locations[0] + 2)] = '\0';
          *(int *)(lev_local->locations[0] + 2) = *(int *)(lev_local->locations[0] + 2) + 1;
        }
        else {
          impossible("spo_region: region as subroom");
        }
      }
      if (poStack_38 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(poStack_38);
        poStack_38 = (opvar *)0x0;
      }
      if (area == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(area);
        area = (opvar *)0x0;
      }
      if (rirreg == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(rirreg);
        rirreg = (opvar *)0x0;
      }
      if (rlit == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(rlit);
      }
    }
    else {
      if (local_4a == 0) {
        impossible("Too many rooms on new level!");
      }
      local_51.rlit = (xchar)(rirreg->vardata).l;
      local_51.x1 = troom._7_1_;
      local_51.y1 = troom._6_1_;
      local_51.x2 = troom._5_1_;
      local_51.y2 = troom._4_1_;
      light_region((level *)rtype,&local_51);
      if (poStack_38 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(poStack_38);
        poStack_38 = (opvar *)0x0;
      }
      if (area == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(area);
        area = (opvar *)0x0;
      }
      if (rirreg == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(rirreg);
        rirreg = (opvar *)0x0;
      }
      if (rlit == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_region");
      }
      else {
        opvar_free_x(rlit);
      }
    }
  }
  return;
}

Assistant:

static void spo_region(struct sp_coder *coder, struct level *lev)
{
	struct opvar *rtype, *rlit, *rirreg, *area;
	xchar dx1, dy1, dx2, dy2;
	struct mkroom *troom;
	boolean prefilled, room_not_needed;

	if (!OV_pop_i(rirreg) ||
	    !OV_pop_i(rtype) ||
	    !OV_pop_i(rlit) ||
	    !OV_pop_r(area)) return;

	if (OV_i(rtype) > MAXRTYPE) {
	    OV_i(rtype) -= MAXRTYPE + 1;
	    prefilled = TRUE;
	} else {
	    prefilled = FALSE;
	}

	if (OV_i(rlit) < 0) {
	    OV_i(rlit) = (rnd(1 + abs(depth(&lev->z))) < 11 && rn2(77)) ?
			 TRUE : FALSE;
	}

	dx1 = SP_REGION_X1(OV_i(area));
	dy1 = SP_REGION_Y1(OV_i(area));
	dx2 = SP_REGION_X2(OV_i(area));
	dy2 = SP_REGION_Y2(OV_i(area));

	get_location(lev, &dx1, &dy1, DRY|WET, NULL);
	get_location(lev, &dx2, &dy2, DRY|WET, NULL);

	/* for an ordinary room, `prefilled' is a flag to force
	   an actual room to be created (such rooms are used to
	   control placement of migrating monster arrivals) */
	room_not_needed = (OV_i(rtype) == OROOM &&
			   !OV_i(rirreg) && !prefilled);
	if (room_not_needed || lev->nroom >= MAXNROFROOMS) {
	    region tmpregion;
	    if (!room_not_needed)
		impossible("Too many rooms on new level!");
	    tmpregion.rlit = OV_i(rlit);
	    tmpregion.x1 = dx1;
	    tmpregion.y1 = dy1;
	    tmpregion.x2 = dx2;
	    tmpregion.y2 = dy2;
	    light_region(lev, &tmpregion);

	    opvar_free(area);
	    opvar_free(rirreg);
	    opvar_free(rlit);
	    opvar_free(rtype);

	    return;
	}

	troom = &lev->rooms[lev->nroom];

	/* mark rooms that must be filled, but do it later */
	if (OV_i(rtype) != OROOM)
	    troom->needfill = prefilled ? 2 : 1;

	if (OV_i(rirreg)) {
	    min_rx = max_rx = dx1;
	    min_ry = max_ry = dy1;
	    flood_fill_rm(lev, dx1, dy1, lev->nroom + ROOMOFFSET,
			  OV_i(rlit), TRUE);
	    add_room(lev, min_rx, min_ry, max_rx, max_ry,
		     FALSE, OV_i(rtype), TRUE);
	    troom->rlit = OV_i(rlit);
	    troom->irregular = TRUE;
	} else {
	    add_room(lev, dx1, dy1, dx2, dy2,
		     OV_i(rlit), OV_i(rtype), TRUE);
	    topologize(lev, troom);	/* set roomno */
	}

	if (!room_not_needed) {
	    if (coder->n_subroom > 1) {
		impossible("spo_region: region as subroom");
	    } else {
		coder->tmproomlist[coder->n_subroom] = troom;
		coder->failed_room[coder->n_subroom] = FALSE;
		coder->n_subroom++;
	    }
	}

	opvar_free(area);
	opvar_free(rirreg);
	opvar_free(rlit);
	opvar_free(rtype);
}